

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downsize.cpp
# Opt level: O1

int downsize(string *f_input,string *f_output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  char cVar4;
  long lVar5;
  istream *piVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pbVar13;
  __string_type __str;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  ofstream w_file;
  ifstream r_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  unsigned_long local_4c0;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 *local_478;
  long local_470;
  undefined1 local_468;
  undefined7 uStack_467;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  string *local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [14];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,(string *)f_input,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: File ",0xc);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(f_input->_M_dataplus)._M_p,f_input->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not exist",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    iVar9 = 1;
    std::ostream::flush();
  }
  else {
    lVar5 = std::__cxx11::string::find((char *)f_input,0x10711a,0);
    if ((((lVar5 == -1) &&
         (lVar5 = std::__cxx11::string::find((char *)f_input,0x10711f,0), lVar5 == -1)) &&
        (lVar5 = std::__cxx11::string::find((char *)f_input,0x107124,0), lVar5 == -1)) &&
       (lVar5 = std::__cxx11::string::find((char *)f_input,0x107129,0), lVar5 == -1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: File extension is not supported",0x26);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      iVar9 = 1;
      std::ifstream::close();
    }
    else {
      local_478 = &local_468;
      local_470 = 0;
      local_468 = 0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      paVar1 = &local_4b8.field_2;
      local_440 = f_output;
      while( true ) {
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_478,cVar4);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
        local_4b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4b8,local_478,local_478 + local_470);
        trim((string *)local_438,&local_4b8);
        lVar5 = std::__cxx11::string::find((char *)local_438,0x107155,0);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find((char *)local_438,0x107158,0);
          if ((lVar5 == -1) || (downsize_line(std::__cxx11::string)::header != '\x01')) {
            lVar5 = std::__cxx11::string::find((char *)local_438,0x10715b,0);
            if ((lVar5 == -1) && (*(char *)local_438._0_8_ != '#')) {
              if (downsize_line(std::__cxx11::string)::header != '\x01') {
                std::__cxx11::string::_M_assign((string *)&local_4b8);
                local_4e8._M_dataplus._M_p = (pointer)0x0;
                local_4e8._M_string_length = 0;
                local_4e8.field_2._M_allocated_capacity = 0;
                local_4c0 = std::__cxx11::string::find((char *)&local_4b8,0x10715e,0);
                p_Var7 = dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                while (dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                            p_Var7, local_4c0 != 0xffffffffffffffff) {
                  if (local_4e8._M_string_length == local_4e8.field_2._M_allocated_capacity) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_4e8,
                               (iterator)local_4e8._M_string_length,&local_4c0);
                  }
                  else {
                    *(unsigned_long *)local_4e8._M_string_length = local_4c0;
                    local_4e8._M_string_length = local_4e8._M_string_length + 8;
                  }
                  local_4c0 = std::__cxx11::string::find((char *)&local_4b8,0x10715e,local_4c0 + 1);
                  p_Var7 = dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                }
                local_4c0 = 0xffffffffffffffff;
                if ((_Rb_tree_header *)p_Var7 !=
                    &dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                  uVar11 = 0;
                  local_4c0 = 0xffffffffffffffff;
                  do {
                    uVar10 = *(ulong *)(p_Var7 + 1);
                    uVar12 = 0;
                    while (local_4c0 = std::__cxx11::string::find((char *)&local_4b8,uVar10,uVar12),
                          local_4c0 != 0xffffffffffffffff) {
                      if (local_4e8._M_string_length - (long)local_4e8._M_dataplus._M_p != 0) {
                        uVar10 = 0;
                        do {
                          if (local_4c0 <
                              *(long *)(local_4e8._M_dataplus._M_p + uVar10 * 8) - uVar11) {
                            lVar5 = 1;
                            if ((uVar10 & 1) != 0) goto LAB_00105146;
                            break;
                          }
                          uVar10 = (ulong)((int)uVar10 + 1);
                        } while (uVar10 < (ulong)((long)(local_4e8._M_string_length -
                                                        (long)local_4e8._M_dataplus._M_p) >> 3));
                      }
                      if (p_Var7[2]._M_parent == (_Base_ptr)0x0) {
                        std::__cxx11::string::erase((ulong)&local_4b8,local_4c0);
                        uVar11 = (ulong)((int)uVar11 + 1);
                        lVar5 = 0;
                      }
                      else {
                        lVar5 = 1;
                        std::__cxx11::string::replace
                                  ((ulong)&local_4b8,local_4c0,(char *)p_Var7[1]._M_parent,
                                   *(ulong *)(p_Var7 + 2));
                      }
LAB_00105146:
                      uVar12 = lVar5 + local_4c0;
                      uVar10 = *(ulong *)(p_Var7 + 1);
                    }
                    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
                  } while ((_Rb_tree_header *)p_Var7 !=
                           &dic_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_4e8._M_dataplus._M_p,
                                  local_4e8.field_2._M_allocated_capacity -
                                  (long)local_4e8._M_dataplus._M_p);
                }
                goto LAB_00104f09;
              }
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4e8,local_4b8._M_dataplus._M_p,
                         local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
              std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_4e8,local_4e8._M_string_length,0,'\x01');
            }
            else {
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4e8,local_4b8._M_dataplus._M_p,
                         local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
              std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_4e8,local_4e8._M_string_length,0,'\x01');
            }
          }
          else {
            downsize_line(std::__cxx11::string)::header = '\0';
            local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4e8,local_4b8._M_dataplus._M_p,
                       local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_4e8,local_4e8._M_string_length,0,'\x01');
          }
          std::__cxx11::string::operator=((string *)&local_4b8,(string *)&local_4e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if (downsize_line(std::__cxx11::string)::first_header == '\x01') {
            std::operator+(&local_4e8,'\n',&local_4b8);
            std::__cxx11::string::operator=((string *)&local_4b8,(string *)&local_4e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          lVar5 = std::__cxx11::string::find((char *)local_438,0x107158,0);
          if (lVar5 == -1) {
            downsize_line(std::__cxx11::string)::header = '\x01';
          }
          downsize_line(std::__cxx11::string)::first_header = '\x01';
        }
LAB_00104f09:
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p == paVar1) {
          local_498.field_2._8_8_ = local_4b8.field_2._8_8_;
        }
        else {
          local_498._M_dataplus._M_p = local_4b8._M_dataplus._M_p;
        }
        local_498.field_2._M_allocated_capacity._1_7_ =
             local_4b8.field_2._M_allocated_capacity._1_7_;
        local_498.field_2._M_local_buf[0] = local_4b8.field_2._M_local_buf[0];
        local_498._M_string_length = local_4b8._M_string_length;
        local_4b8._M_string_length = 0;
        local_4b8.field_2._M_local_buf[0] = '\0';
        local_4b8._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_458,
                   &local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_4b8._M_dataplus._M_p,
                          CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                                   local_4b8.field_2._M_local_buf[0]) + 1);
        }
      }
      std::ifstream::close();
      std::ofstream::ofstream(local_438,(string *)local_440,_S_trunc|_S_in);
      pbVar3 = local_458.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_458.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_458.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar13 = local_458.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar2 = (pbVar13->_M_dataplus)._M_p;
          local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e8,pcVar2,pcVar2 + pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar3);
      }
      std::ofstream::close();
      local_438._0_8_ = _VTT;
      *(undefined8 *)(local_438 + *(long *)(_VTT->_M_local_buf + -0x18)) = __filebuf;
      std::filebuf::~filebuf((filebuf *)(local_438 + 8));
      std::ios_base::~ios_base(local_340);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_458);
      if (local_478 != &local_468) {
        operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
      }
      iVar9 = 0;
    }
  }
  std::ifstream::~ifstream(local_238);
  return iVar9;
}

Assistant:

int downsize(const std::string f_input, const std::string f_output) {
    std::ifstream r_file(f_input, std::ios::out);
    if (!r_file.is_open()) {
        std::cout << "Error: File " << f_input << " does not exist" << std::endl;
        return EXIT_FAILURE;
    }
    if (
            (f_input.find(".sqf") == std::string::npos) &&
            (f_input.find(".hpp") == std::string::npos) &&
            (f_input.find(".ext") == std::string::npos) &&
            (f_input.find(".cpp") == std::string::npos)
        ) {
        std::cout << "Error: File extension is not supported" << std::endl;
        r_file.close();
        return EXIT_FAILURE;
    }

    std::string line;
    std::vector<std::string> content;
    while (getline(r_file, line)) {
        content.push_back(downsize_line(line));
    }
    r_file.close();

    std::ofstream w_file(f_output, std::ios::in | std::ios::trunc);
    for (std::string n : content) {
        w_file << n;
    }
    w_file.close();

    return EXIT_SUCCESS;
}